

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

_Bool ssh_share_test_for_upstream(char *host,int port,Conf *conf)

{
  int iVar1;
  char *pi_name;
  Socket *sock;
  char *us_err;
  char *ds_err;
  char *logtext;
  
  pi_name = ssh_share_sockname(host,port,conf);
  sock = (Socket *)0x0;
  us_err = (char *)0x0;
  ds_err = (char *)0x0;
  logtext = (char *)0x0;
  iVar1 = platform_ssh_share(pi_name,conf,&nullplug_plug,(Plug *)0x0,&sock,&logtext,&ds_err,&us_err,
                             false,true);
  safefree(logtext);
  safefree(ds_err);
  safefree(us_err);
  safefree(pi_name);
  if (iVar1 == 0) {
    if (sock != (Socket *)0x0) {
      __assert_fail("sock == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x7f4,"_Bool ssh_share_test_for_upstream(const char *, int, Conf *)");
    }
  }
  else {
    if (iVar1 != 1) {
      __assert_fail("result == SHARE_DOWNSTREAM",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x7f7,"_Bool ssh_share_test_for_upstream(const char *, int, Conf *)");
    }
    (*sock->vt->close)(sock);
  }
  return iVar1 != 0;
}

Assistant:

bool ssh_share_test_for_upstream(const char *host, int port, Conf *conf)
{
    char *sockname, *logtext, *ds_err, *us_err;
    int result;
    Socket *sock;

    sockname = ssh_share_sockname(host, port, conf);

    sock = NULL;
    logtext = ds_err = us_err = NULL;
    result = platform_ssh_share(sockname, conf, nullplug, (Plug *)NULL, &sock,
                                &logtext, &ds_err, &us_err, false, true);

    sfree(logtext);
    sfree(ds_err);
    sfree(us_err);
    sfree(sockname);

    if (result == SHARE_NONE) {
        assert(sock == NULL);
        return false;
    } else {
        assert(result == SHARE_DOWNSTREAM);
        sk_close(sock);
        return true;
    }
}